

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O0

void defaultPanic(TidyAllocator *allocator,ctmbstr msg)

{
  ctmbstr msg_local;
  TidyAllocator *allocator_local;
  
  if (g_panic != (TidyPanic)0x0) {
    (*g_panic)(msg);
    return;
  }
  fprintf(_stderr,"Fatal error: %s\n",msg);
  exit(2);
}

Assistant:

static void TIDY_CALL defaultPanic( TidyAllocator* ARG_UNUSED(allocator), ctmbstr msg )
{
  if ( g_panic )
    g_panic( msg );
  else
  {
    /* 2 signifies a serious error */
    fprintf( stderr, "Fatal error: %s\n", msg );
#ifdef _DEBUG
    assert(0);
#endif
    exit(2);
  }
}